

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

void sh_delentry(curl_hash *sh,curl_socket_t s)

{
  void *pvVar1;
  curl_socket_t local_c;
  
  local_c = s;
  pvVar1 = Curl_hash_pick(sh,&local_c,4);
  if (pvVar1 != (void *)0x0) {
    Curl_hash_delete(sh,&local_c,4);
  }
  return;
}

Assistant:

static void sh_delentry(struct curl_hash *sh, curl_socket_t s)
{
  struct Curl_sh_entry *there =
    Curl_hash_pick(sh, (char *)&s, sizeof(curl_socket_t));

  if(there) {
    /* this socket is in the hash */
    /* We remove the hash entry. (This'll end up in a call to
       sh_freeentry().) */
    Curl_hash_delete(sh, (char *)&s, sizeof(curl_socket_t));
  }
}